

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_sliver_layers(Omega_h *this,Mesh *mesh,Real qual_ceil,Int nlayers)

{
  int *piVar1;
  Alloc *pAVar2;
  Omega_h_Parting OVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Read<signed_char> RVar5;
  Bytes elems_are_slivers;
  Reals quals;
  Read<signed_char> local_68;
  Read<double> local_58;
  Alloc *local_48;
  void *local_40;
  Real local_38;
  Alloc *local_30;
  element_type *local_28;
  void *pvVar4;
  
  local_38 = qual_ceil;
  OVar3 = Mesh::parting(mesh);
  if (OVar3 == OMEGA_H_GHOSTED) {
    Mesh::ask_qualities((Mesh *)&local_30);
    local_58.write_.shared_alloc_.alloc = local_30;
    if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc = (Alloc *)(local_30->size * 8 + 1);
      }
      else {
        local_30->use_count = local_30->use_count + 1;
      }
    }
    local_58.write_.shared_alloc_.direct_ptr = local_28;
    each_lt<double>((Omega_h *)&local_48,&local_58,local_38);
    pAVar2 = local_58.write_.shared_alloc_.alloc;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_68.write_.shared_alloc_.alloc = local_48;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
      }
      else {
        local_48->use_count = local_48->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = local_40;
    RVar5 = mark_dual_layers(this,mesh,&local_68,nlayers);
    pAVar2 = local_68.write_.shared_alloc_.alloc;
    pvVar4 = RVar5.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX;
      }
    }
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      piVar1 = &local_48->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48);
        operator_delete(local_48,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
      piVar1 = &local_30->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30);
        operator_delete(local_30,0x48);
        pvVar4 = extraout_RDX_01;
      }
    }
    RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0xd0);
}

Assistant:

Read<I8> mark_sliver_layers(Mesh* mesh, Real qual_ceil, Int nlayers) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto quals = mesh->ask_qualities();
  auto elems_are_slivers = each_lt(quals, qual_ceil);
  return mark_dual_layers(mesh, elems_are_slivers, nlayers);
}